

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concur19.cc
# Opt level: O0

void __thiscall
tchecker::tck_reach::concur19::node_le_t::node_le_t
          (node_le_t *this,shared_ptr<tchecker::clockbounds::clockbounds_t> *clockbounds)

{
  clock_id_t cVar1;
  element_type *peVar2;
  map_t *pmVar3;
  shared_ptr<tchecker::clockbounds::clockbounds_t> *clockbounds_local;
  node_le_t *this_local;
  
  std::shared_ptr<tchecker::clockbounds::clockbounds_t>::shared_ptr(&this->_clockbounds,clockbounds)
  ;
  peVar2 = std::
           __shared_ptr_access<tchecker::clockbounds::clockbounds_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<tchecker::clockbounds::clockbounds_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  cVar1 = tchecker::clockbounds::clockbounds_t::clocks_number(peVar2);
  pmVar3 = tchecker::clockbounds::allocate_map((ulong)cVar1);
  this->_l = pmVar3;
  peVar2 = std::
           __shared_ptr_access<tchecker::clockbounds::clockbounds_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<tchecker::clockbounds::clockbounds_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  cVar1 = tchecker::clockbounds::clockbounds_t::clocks_number(peVar2);
  pmVar3 = tchecker::clockbounds::allocate_map((ulong)cVar1);
  this->_u = pmVar3;
  return;
}

Assistant:

node_le_t::node_le_t(std::shared_ptr<tchecker::clockbounds::clockbounds_t> const & clockbounds) : _clockbounds(clockbounds)
{
  _l = tchecker::clockbounds::allocate_map(_clockbounds->clocks_number());
  _u = tchecker::clockbounds::allocate_map(_clockbounds->clocks_number());
}